

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void __thiscall AActor::CallTouch(AActor *this,AActor *toucher)

{
  VMFunction *func;
  PClass *pPVar1;
  VMFrameStack *this_00;
  long lVar2;
  VMValue params [2];
  
  if (CallTouch::VIndex == 0xffffffff) {
    CallTouch::VIndex = GetVirtualIndex(RegistrationInfo.MyClass,"Touch");
    if (CallTouch::VIndex == 0xffffffff) {
      __assert_fail("VIndex != ~0u",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x5db,"void AActor::CallTouch(AActor *)");
    }
  }
  pPVar1 = DObject::GetClass((DObject *)this);
  if ((CallTouch::VIndex < (pPVar1->Virtuals).Count) &&
     (func = (pPVar1->Virtuals).Array[CallTouch::VIndex], func != (VMFunction *)0x0)) {
    params[0].field_0._8_4_ = 1;
    params[0].field_0.field_3.Type = '\x03';
    params[1].field_0.field_3.Type = '\x03';
    params[0].field_0._0_8_ = this;
    params[1].field_0._0_8_ = toucher;
    params[1].field_0._8_4_ = params[0].field_0._8_4_;
    this_00 = (VMFrameStack *)_ZTW13GlobalVMStack();
    VMFrameStack::Call(this_00,func,params,2,(VMReturn *)0x0,0,(VMException **)0x0);
    lVar2 = 0x10;
    do {
      VMValue::~VMValue((VMValue *)((long)&params[0].field_0 + lVar2));
      lVar2 = lVar2 + -0x10;
    } while (lVar2 != -0x10);
    return;
  }
  (*(this->super_DThinker).super_DObject._vptr_DObject[0x13])(this,toucher);
  return;
}

Assistant:

void AActor::CallTouch(AActor *toucher)
{
	IFVIRTUAL(AActor, Touch)
	{
		VMValue params[2] = { (DObject*)this, toucher };
		GlobalVMStack.Call(func, params, 2, nullptr, 0, nullptr);
	}
	else Touch(toucher);
}